

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int obmc_refining_search_sad(FULLPEL_MOTION_SEARCH_PARAMS *ms_params,FULLPEL_MV *best_mv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint8_t *puVar4;
  short *in_RSI;
  long in_RDI;
  uint sad;
  FULLPEL_MV mv;
  int j;
  int best_site;
  int i;
  uint best_sad;
  int kSearchRange;
  FULLPEL_MV neighbors [4];
  buf_2d *ref_buf;
  int32_t *mask;
  int32_t *wsrc;
  MSBuffers *ms_buffers;
  MV_COST_PARAMS *mv_cost_params;
  aom_variance_fn_ptr_t *fn_ptr;
  MV_COST_PARAMS *in_stack_ffffffffffffff78;
  MV_COST_PARAMS *mv_cost_params_00;
  buf_2d *buf;
  FULLPEL_MV local_70;
  int local_6c;
  int local_68;
  int local_64;
  uint local_60;
  short local_58 [12];
  long local_40;
  undefined8 local_38;
  undefined8 local_30;
  long *local_28;
  long local_20;
  long local_18;
  short *local_10;
  long local_8;
  
  local_18 = *(long *)(in_RDI + 8);
  local_20 = in_RDI + 0x98;
  local_28 = (long *)(in_RDI + 0x10);
  local_30 = *(undefined8 *)(in_RDI + 0x38);
  local_38 = *(undefined8 *)(in_RDI + 0x40);
  local_40 = *local_28;
  local_58[0] = -1;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = -1;
  local_58[4] = 0;
  local_58[5] = 1;
  local_58[6] = 1;
  local_58[7] = 0;
  buf = *(buf_2d **)(local_18 + 0x58);
  local_10 = in_RSI;
  local_8 = in_RDI;
  puVar4 = get_buf_from_fullmv(buf,(FULLPEL_MV *)in_stack_ffffffffffffff78);
  iVar1 = (*(code *)buf)(puVar4,*(undefined4 *)(local_40 + 0x18),local_30,local_38);
  iVar2 = mvsad_err_cost_((FULLPEL_MV *)buf,in_stack_ffffffffffffff78);
  local_60 = iVar1 + iVar2;
  local_64 = 0;
  while( true ) {
    if (7 < local_64) {
      return local_60;
    }
    local_68 = -1;
    for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
      local_70.col = local_10[1] + local_58[(long)local_6c * 2 + 1];
      local_70.row = *local_10 + local_58[(long)local_6c * 2];
      iVar1 = av1_is_fullmv_in_range((FullMvLimits *)(local_8 + 0x58),local_70);
      if (iVar1 != 0) {
        mv_cost_params_00 = *(MV_COST_PARAMS **)(local_18 + 0x58);
        puVar4 = get_buf_from_fullmv(buf,(FULLPEL_MV *)mv_cost_params_00);
        uVar3 = (*(code *)mv_cost_params_00)
                          (puVar4,*(undefined4 *)(local_40 + 0x18),local_30,local_38);
        if (uVar3 < local_60) {
          iVar1 = mvsad_err_cost_((FULLPEL_MV *)buf,mv_cost_params_00);
          if (iVar1 + uVar3 < local_60) {
            local_68 = local_6c;
            local_60 = iVar1 + uVar3;
          }
        }
      }
    }
    if (local_68 == -1) break;
    *local_10 = *local_10 + local_58[(long)local_68 * 2];
    local_10[1] = local_10[1] + local_58[(long)local_68 * 2 + 1];
    local_64 = local_64 + 1;
  }
  return local_60;
}

Assistant:

static int obmc_refining_search_sad(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params, FULLPEL_MV *best_mv) {
  const aom_variance_fn_ptr_t *fn_ptr = ms_params->vfp;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const MSBuffers *ms_buffers = &ms_params->ms_buffers;
  const int32_t *wsrc = ms_buffers->wsrc;
  const int32_t *mask = ms_buffers->obmc_mask;
  const struct buf_2d *ref_buf = ms_buffers->ref;
  const FULLPEL_MV neighbors[4] = { { -1, 0 }, { 0, -1 }, { 0, 1 }, { 1, 0 } };
  const int kSearchRange = 8;

  unsigned int best_sad = fn_ptr->osdf(get_buf_from_fullmv(ref_buf, best_mv),
                                       ref_buf->stride, wsrc, mask) +
                          mvsad_err_cost_(best_mv, mv_cost_params);

  for (int i = 0; i < kSearchRange; i++) {
    int best_site = -1;

    for (int j = 0; j < 4; j++) {
      const FULLPEL_MV mv = { best_mv->row + neighbors[j].row,
                              best_mv->col + neighbors[j].col };
      if (av1_is_fullmv_in_range(&ms_params->mv_limits, mv)) {
        unsigned int sad = fn_ptr->osdf(get_buf_from_fullmv(ref_buf, &mv),
                                        ref_buf->stride, wsrc, mask);
        if (sad < best_sad) {
          sad += mvsad_err_cost_(&mv, mv_cost_params);

          if (sad < best_sad) {
            best_sad = sad;
            best_site = j;
          }
        }
      }
    }

    if (best_site == -1) {
      break;
    } else {
      best_mv->row += neighbors[best_site].row;
      best_mv->col += neighbors[best_site].col;
    }
  }
  return best_sad;
}